

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  byte bVar1;
  const_pointer pcVar2;
  const_pointer pcVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  uint32_t flags;
  StartInfo *info;
  bool bVar7;
  LogMessage local_1a0;
  
  pcVar2 = (params->text).data_;
  pcVar3 = (params->context).data_;
  if (pcVar2 < pcVar3) {
LAB_001c821b:
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
               ,0x674);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"context does not contain text",0x1d);
    LogMessage::~LogMessage(&local_1a0);
    params->start = (State *)0x1;
    return true;
  }
  pbVar6 = (byte *)(pcVar2 + (params->text).size_);
  if (pcVar3 + (params->context).size_ < pbVar6) goto LAB_001c821b;
  if (params->run_forward == true) {
    if (pcVar2 == pcVar3) {
LAB_001c8288:
      flags = 5;
      uVar5 = 0;
      goto LAB_001c82c4;
    }
    bVar1 = pcVar2[-1];
  }
  else {
    if (pbVar6 == (byte *)(pcVar3 + (params->context).size_)) goto LAB_001c8288;
    bVar1 = *pbVar6;
  }
  if (bVar1 == 10) {
    flags = 1;
    uVar5 = 2;
  }
  else {
    bVar4 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
    bVar7 = (byte)(bVar1 - 0x30) < 10;
    uVar5 = (uint)((bVar1 != 0x5f && !bVar7) && !bVar4) * 2 + 4;
    flags = (uint)((bVar1 == 0x5f || bVar7) || bVar4) << 9;
  }
LAB_001c82c4:
  uVar5 = (uVar5 | params->anchored) << 4;
  info = (StartInfo *)((long)&this->start_[0].start + (ulong)uVar5);
  bVar4 = AnalyzeSearchHelper(this,params,info,flags);
  if (!bVar4) {
    ResetCache(this,params->cache_lock);
    bVar4 = AnalyzeSearchHelper(this,params,info,flags);
    if (!bVar4) {
      LogMessage::LogMessage
                (&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                 ,0x6a3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0.str_,"Failed to analyze start state.",0x1e);
      LogMessage::~LogMessage(&local_1a0);
      params->failed = true;
      return false;
    }
  }
  params->start = info->start;
  params->first_byte =
       *(int *)((long)&this->start_[0].first_byte.super___atomic_base<int>._M_i + (ulong)uVar5);
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "context does not contain text";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint32_t flags;
  if (params->run_forward) {
    if (text.begin() == context.begin()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.begin()[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.begin()[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (text.end() == context.end()) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (text.end()[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(text.end()[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored)
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      LOG(DFATAL) << "Failed to analyze start state.";
      params->failed = true;
      return false;
    }
  }

  if (ExtraDebug)
    fprintf(stderr, "anchored=%d fwd=%d flags=%#x state=%s first_byte=%d\n",
            params->anchored, params->run_forward, flags,
            DumpState(info->start).c_str(), info->first_byte.load());

  params->start = info->start;
  params->first_byte = info->first_byte.load(std::memory_order_acquire);

  return true;
}